

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall
ClipperLib::Clipper::JoinPoints(Clipper *this,Join *j,OutRec *outRec1,OutRec *outRec2)

{
  IntPoint Pt_00;
  IntPoint pt3;
  IntPoint pt3_00;
  IntPoint pt3_01;
  IntPoint pt3_02;
  OutPt *pOVar1;
  bool bVar2;
  OutPt *pOVar3;
  undefined1 in_stack_fffffffffffffe7c [12];
  byte local_173;
  byte local_170;
  bool local_16a;
  bool local_169;
  bool Reverse2;
  bool Reverse1;
  bool local_79;
  undefined1 auStack_78 [7];
  bool DiscardLeftSide;
  IntPoint Pt;
  cInt Right;
  cInt Left;
  bool reverse2;
  bool reverse1;
  OutPt *pOStack_50;
  bool isHorizontal;
  OutPt *op2b;
  OutPt *op2;
  OutPt *op1b;
  OutPt *op1;
  OutRec *outRec2_local;
  OutRec *outRec1_local;
  Join *j_local;
  Clipper *this_local;
  
  op1b = j->OutPt1;
  op2b = j->OutPt2;
  Left._7_1_ = (j->OutPt1->Pt).Y == (j->OffPt).Y;
  op1 = (OutPt *)outRec2;
  outRec2_local = outRec1;
  outRec1_local = (OutRec *)j;
  j_local = (Join *)this;
  if ((((bool)Left._7_1_) && (bVar2 = ClipperLib::operator==(&j->OffPt,&j->OutPt1->Pt), bVar2)) &&
     (bVar2 = ClipperLib::operator==
                        ((IntPoint *)&outRec1_local->PolyNd,
                         (IntPoint *)&outRec1_local->FirstLeft->FirstLeft), bVar2)) {
    if (outRec2_local == (OutRec *)op1) {
      op2 = *(OutPt **)(*(long *)outRec1_local + 0x18);
      while( true ) {
        local_169 = false;
        if (op2 != op1b) {
          local_169 = ClipperLib::operator==(&op2->Pt,(IntPoint *)&outRec1_local->PolyNd);
        }
        if (local_169 == false) break;
        op2 = op2->Next;
      }
      Left._6_1_ = (long)outRec1_local->Pts < (op2->Pt).Y;
      pOStack_50 = outRec1_local->FirstLeft->Pts;
      while( true ) {
        local_16a = false;
        if (pOStack_50 != op2b) {
          local_16a = ClipperLib::operator==(&pOStack_50->Pt,(IntPoint *)&outRec1_local->PolyNd);
        }
        if (local_16a == false) break;
        pOStack_50 = pOStack_50->Next;
      }
      Left._5_1_ = (long)outRec1_local->Pts < (pOStack_50->Pt).Y;
      if ((Left._6_1_ & 1) == Left._5_1_) {
        this_local._7_1_ = false;
      }
      else if ((Left._6_1_ & 1) == 0) {
        op2 = DupOutPt(op1b,true);
        pOVar3 = DupOutPt(op2b,false);
        op1b->Next = op2b;
        op2b->Prev = op1b;
        op2->Prev = pOVar3;
        pOVar3->Next = op2;
        *(OutPt **)outRec1_local = op1b;
        outRec1_local->FirstLeft = (OutRec *)op2;
        this_local._7_1_ = true;
      }
      else {
        op2 = DupOutPt(op1b,false);
        pOVar3 = DupOutPt(op2b,true);
        op1b->Prev = op2b;
        op2b->Next = op1b;
        op2->Next = pOVar3;
        pOVar3->Prev = op2;
        *(OutPt **)outRec1_local = op1b;
        outRec1_local->FirstLeft = (OutRec *)op2;
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    pOVar1 = op1b;
    pOVar3 = op2b;
    if ((Left._7_1_ & 1) == 0) {
      op2 = op1b->Next;
      while (bVar2 = ClipperLib::operator==(&op2->Pt,&op1b->Pt), bVar2 && op2 != op1b) {
        op2 = op2->Next;
      }
      local_170 = 1;
      if ((op2->Pt).Y <= (op1b->Pt).Y) {
        pt3.X = (cInt)outRec1_local->PolyNd;
        pt3.Y = (cInt)outRec1_local->Pts;
        bVar2 = SlopesEqual(op1b->Pt,op2->Pt,pt3,
                            (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                         [(long)&(this->m_GhostJoins).
                                                 super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                         ] & 1));
        local_170 = bVar2 ^ 0xff;
      }
      local_170 = local_170 & 1;
      if (local_170 != 0) {
        op2 = op1b->Prev;
        while (bVar2 = ClipperLib::operator==(&op2->Pt,&op1b->Pt), bVar2 && op2 != op1b) {
          op2 = op2->Prev;
        }
        if (((op1b->Pt).Y < (op2->Pt).Y) ||
           (pt3_00.X = (cInt)outRec1_local->PolyNd, pt3_00.Y = (cInt)outRec1_local->Pts,
           bVar2 = SlopesEqual(op1b->Pt,op2->Pt,pt3_00,
                               (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                            [(long)&(this->m_GhostJoins).
                                                                                                        
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                            ] & 1)), !bVar2)) {
          return false;
        }
      }
      pOStack_50 = op2b->Next;
      while (bVar2 = ClipperLib::operator==(&pOStack_50->Pt,&op2b->Pt), bVar2 && pOStack_50 != op2b)
      {
        pOStack_50 = pOStack_50->Next;
      }
      local_173 = 1;
      if ((pOStack_50->Pt).Y <= (op2b->Pt).Y) {
        pt3_01.X = (cInt)outRec1_local->PolyNd;
        pt3_01.Y = (cInt)outRec1_local->Pts;
        bVar2 = SlopesEqual(op2b->Pt,pOStack_50->Pt,pt3_01,
                            (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                         [(long)&(this->m_GhostJoins).
                                                 super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                         ] & 1));
        local_173 = bVar2 ^ 0xff;
      }
      if ((local_173 & 1) != 0) {
        pOStack_50 = op2b->Prev;
        while (bVar2 = ClipperLib::operator==(&pOStack_50->Pt,&op2b->Pt),
              bVar2 && pOStack_50 != op2b) {
          pOStack_50 = pOStack_50->Prev;
        }
        if (((op2b->Pt).Y < (pOStack_50->Pt).Y) ||
           (pt3_02.X = (cInt)outRec1_local->PolyNd, pt3_02.Y = (cInt)outRec1_local->Pts,
           bVar2 = SlopesEqual(op2b->Pt,pOStack_50->Pt,pt3_02,
                               (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                            [(long)&(this->m_GhostJoins).
                                                                                                        
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                            ] & 1)), !bVar2)) {
          return false;
        }
      }
      if ((((op2 == op1b) || (pOStack_50 == op2b)) || (op2 == pOStack_50)) ||
         ((outRec2_local == (OutRec *)op1 && (local_170 == (local_173 & 1))))) {
        this_local._7_1_ = false;
      }
      else if (local_170 == 0) {
        op2 = DupOutPt(op1b,true);
        pOVar3 = DupOutPt(op2b,false);
        op1b->Next = op2b;
        op2b->Prev = op1b;
        op2->Prev = pOVar3;
        pOVar3->Next = op2;
        *(OutPt **)outRec1_local = op1b;
        outRec1_local->FirstLeft = (OutRec *)op2;
        this_local._7_1_ = true;
      }
      else {
        op2 = DupOutPt(op1b,false);
        pOVar3 = DupOutPt(op2b,true);
        op1b->Prev = op2b;
        op2b->Next = op1b;
        op2->Next = pOVar3;
        pOVar3->Prev = op2;
        *(OutPt **)outRec1_local = op1b;
        outRec1_local->FirstLeft = (OutRec *)op2;
        this_local._7_1_ = true;
      }
    }
    else {
      op2 = op1b;
      while( true ) {
        bVar2 = false;
        if (((op1b->Prev->Pt).Y == (op1b->Pt).Y) && (bVar2 = false, op1b->Prev != pOVar1)) {
          bVar2 = op1b->Prev != op2b;
        }
        if (!bVar2) break;
        op1b = op1b->Prev;
      }
      while( true ) {
        bVar2 = false;
        if (((op2->Next->Pt).Y == (op2->Pt).Y) && (bVar2 = false, op2->Next != op1b)) {
          bVar2 = op2->Next != op2b;
        }
        if (!bVar2) break;
        op2 = op2->Next;
      }
      if ((op2->Next == op1b) || (op2->Next == op2b)) {
        this_local._7_1_ = false;
      }
      else {
        pOStack_50 = op2b;
        while( true ) {
          bVar2 = false;
          if (((op2b->Prev->Pt).Y == (op2b->Pt).Y) && (bVar2 = false, op2b->Prev != pOVar3)) {
            bVar2 = op2b->Prev != op2;
          }
          if (!bVar2) break;
          op2b = op2b->Prev;
        }
        while( true ) {
          bVar2 = false;
          if (((pOStack_50->Next->Pt).Y == (pOStack_50->Pt).Y) &&
             (bVar2 = false, pOStack_50->Next != op2b)) {
            bVar2 = pOStack_50->Next != op1b;
          }
          if (!bVar2) break;
          pOStack_50 = pOStack_50->Next;
        }
        if ((pOStack_50->Next == op2b) || (pOStack_50->Next == op1b)) {
          this_local._7_1_ = false;
        }
        else {
          bVar2 = GetOverlap((op1b->Pt).X,(op2->Pt).X,(op2b->Pt).X,(pOStack_50->Pt).X,&Right,&Pt.Y);
          if (bVar2) {
            IntPoint::IntPoint((IntPoint *)auStack_78,0,0);
            if (((op1b->Pt).X < Right) || (Pt.Y < (op1b->Pt).X)) {
              if (((op2b->Pt).X < Right) || (Pt.Y < (op2b->Pt).X)) {
                if (((op2->Pt).X < Right) || (Pt.Y < (op2->Pt).X)) {
                  _auStack_78 = (OutPt *)(pOStack_50->Pt).X;
                  Pt.X = (pOStack_50->Pt).Y;
                  local_79 = (op2b->Pt).X < (pOStack_50->Pt).X;
                }
                else {
                  _auStack_78 = (OutPt *)(op2->Pt).X;
                  Pt.X = (op2->Pt).Y;
                  local_79 = (op1b->Pt).X < (op2->Pt).X;
                }
              }
              else {
                _auStack_78 = (OutPt *)(op2b->Pt).X;
                Pt.X = (op2b->Pt).Y;
                local_79 = (pOStack_50->Pt).X < (op2b->Pt).X;
              }
            }
            else {
              _auStack_78 = (OutPt *)(op1b->Pt).X;
              Pt.X = (op1b->Pt).Y;
              local_79 = (op2->Pt).X < (op1b->Pt).X;
            }
            *(OutPt **)outRec1_local = op1b;
            outRec1_local->FirstLeft = (OutRec *)op2b;
            Pt_00._4_12_ = in_stack_fffffffffffffe7c;
            Pt_00.X._0_4_ = (uint)local_79;
            this_local._7_1_ =
                 JoinHorz((ClipperLib *)op1b,op2,op2b,pOStack_50,_auStack_78,Pt_00,SUB81(Pt.X,0));
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Clipper::JoinPoints(Join *j, OutRec* outRec1, OutRec* outRec2)
{
  OutPt *op1 = j->OutPt1, *op1b;
  OutPt *op2 = j->OutPt2, *op2b;

  //There are 3 kinds of joins for output polygons ...
  //1. Horizontal joins where Join.OutPt1 & Join.OutPt2 are vertices anywhere
  //along (horizontal) collinear edges (& Join.OffPt is on the same horizontal).
  //2. Non-horizontal joins where Join.OutPt1 & Join.OutPt2 are at the same
  //location at the Bottom of the overlapping segment (& Join.OffPt is above).
  //3. StrictSimple joins where edges touch but are not collinear and where
  //Join.OutPt1, Join.OutPt2 & Join.OffPt all share the same point.
  bool isHorizontal = (j->OutPt1->Pt.Y == j->OffPt.Y);

  if (isHorizontal  && (j->OffPt == j->OutPt1->Pt) &&
  (j->OffPt == j->OutPt2->Pt))
  {
    //Strictly Simple join ...
    if (outRec1 != outRec2) return false;
    op1b = j->OutPt1->Next;
    while (op1b != op1 && (op1b->Pt == j->OffPt)) 
      op1b = op1b->Next;
    bool reverse1 = (op1b->Pt.Y > j->OffPt.Y);
    op2b = j->OutPt2->Next;
    while (op2b != op2 && (op2b->Pt == j->OffPt)) 
      op2b = op2b->Next;
    bool reverse2 = (op2b->Pt.Y > j->OffPt.Y);
    if (reverse1 == reverse2) return false;
    if (reverse1)
    {
      op1b = DupOutPt(op1, false);
      op2b = DupOutPt(op2, true);
      op1->Prev = op2;
      op2->Next = op1;
      op1b->Next = op2b;
      op2b->Prev = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    } else
    {
      op1b = DupOutPt(op1, true);
      op2b = DupOutPt(op2, false);
      op1->Next = op2;
      op2->Prev = op1;
      op1b->Prev = op2b;
      op2b->Next = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    }
  } 
  else if (isHorizontal)
  {
    //treat horizontal joins differently to non-horizontal joins since with
    //them we're not yet sure where the overlapping is. OutPt1.Pt & OutPt2.Pt
    //may be anywhere along the horizontal edge.
    op1b = op1;
    while (op1->Prev->Pt.Y == op1->Pt.Y && op1->Prev != op1b && op1->Prev != op2)
      op1 = op1->Prev;
    while (op1b->Next->Pt.Y == op1b->Pt.Y && op1b->Next != op1 && op1b->Next != op2)
      op1b = op1b->Next;
    if (op1b->Next == op1 || op1b->Next == op2) return false; //a flat 'polygon'

    op2b = op2;
    while (op2->Prev->Pt.Y == op2->Pt.Y && op2->Prev != op2b && op2->Prev != op1b)
      op2 = op2->Prev;
    while (op2b->Next->Pt.Y == op2b->Pt.Y && op2b->Next != op2 && op2b->Next != op1)
      op2b = op2b->Next;
    if (op2b->Next == op2 || op2b->Next == op1) return false; //a flat 'polygon'

    cInt Left, Right;
    //Op1 --> Op1b & Op2 --> Op2b are the extremites of the horizontal edges
    if (!GetOverlap(op1->Pt.X, op1b->Pt.X, op2->Pt.X, op2b->Pt.X, Left, Right))
      return false;

    //DiscardLeftSide: when overlapping edges are joined, a spike will created
    //which needs to be cleaned up. However, we don't want Op1 or Op2 caught up
    //on the discard Side as either may still be needed for other joins ...
    IntPoint Pt;
    bool DiscardLeftSide;
    if (op1->Pt.X >= Left && op1->Pt.X <= Right) 
    {
      Pt = op1->Pt; DiscardLeftSide = (op1->Pt.X > op1b->Pt.X);
    } 
    else if (op2->Pt.X >= Left&& op2->Pt.X <= Right) 
    {
      Pt = op2->Pt; DiscardLeftSide = (op2->Pt.X > op2b->Pt.X);
    } 
    else if (op1b->Pt.X >= Left && op1b->Pt.X <= Right)
    {
      Pt = op1b->Pt; DiscardLeftSide = op1b->Pt.X > op1->Pt.X;
    } 
    else
    {
      Pt = op2b->Pt; DiscardLeftSide = (op2b->Pt.X > op2->Pt.X);
    }
    j->OutPt1 = op1; j->OutPt2 = op2;
    return JoinHorz(op1, op1b, op2, op2b, Pt, DiscardLeftSide);
  } else
  {
    //nb: For non-horizontal joins ...
    //    1. Jr.OutPt1.Pt.Y == Jr.OutPt2.Pt.Y
    //    2. Jr.OutPt1.Pt > Jr.OffPt.Y

    //make sure the polygons are correctly oriented ...
    op1b = op1->Next;
    while ((op1b->Pt == op1->Pt) && (op1b != op1)) op1b = op1b->Next;
    bool Reverse1 = ((op1b->Pt.Y > op1->Pt.Y) ||
      !SlopesEqual(op1->Pt, op1b->Pt, j->OffPt, m_UseFullRange));
    if (Reverse1)
    {
      op1b = op1->Prev;
      while ((op1b->Pt == op1->Pt) && (op1b != op1)) op1b = op1b->Prev;
      if ((op1b->Pt.Y > op1->Pt.Y) ||
        !SlopesEqual(op1->Pt, op1b->Pt, j->OffPt, m_UseFullRange)) return false;
    };
    op2b = op2->Next;
    while ((op2b->Pt == op2->Pt) && (op2b != op2))op2b = op2b->Next;
    bool Reverse2 = ((op2b->Pt.Y > op2->Pt.Y) ||
      !SlopesEqual(op2->Pt, op2b->Pt, j->OffPt, m_UseFullRange));
    if (Reverse2)
    {
      op2b = op2->Prev;
      while ((op2b->Pt == op2->Pt) && (op2b != op2)) op2b = op2b->Prev;
      if ((op2b->Pt.Y > op2->Pt.Y) ||
        !SlopesEqual(op2->Pt, op2b->Pt, j->OffPt, m_UseFullRange)) return false;
    }

    if ((op1b == op1) || (op2b == op2) || (op1b == op2b) ||
      ((outRec1 == outRec2) && (Reverse1 == Reverse2))) return false;

    if (Reverse1)
    {
      op1b = DupOutPt(op1, false);
      op2b = DupOutPt(op2, true);
      op1->Prev = op2;
      op2->Next = op1;
      op1b->Next = op2b;
      op2b->Prev = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    } else
    {
      op1b = DupOutPt(op1, true);
      op2b = DupOutPt(op2, false);
      op1->Next = op2;
      op2->Prev = op1;
      op1b->Prev = op2b;
      op2b->Next = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    }
  }
}